

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O2

int __thiscall
iutest::detail::CountIfOverList<iutest::TestSuite*,bool(iutest::TestSuite::*)()const>
          (detail *this,vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list,
          offset_in_TestSuite_to_subr f)

{
  long *plVar1;
  byte bVar2;
  int iVar4;
  long *plVar5;
  vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *pvVar3;
  
  plVar1 = *(long **)(this + 8);
  iVar4 = 0;
  for (plVar5 = *(long **)this; plVar5 != plVar1; plVar5 = plVar5 + 1) {
    pvVar3 = list;
    if (((ulong)list & 1) != 0) {
      pvVar3 = *(vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> **)
                (*(long *)(*plVar5 + f) + -1 + (long)list);
    }
    bVar2 = (*(code *)pvVar3)();
    iVar4 = iVar4 + (uint)bVar2;
  }
  return iVar4;
}

Assistant:

int CountIfOverList(const ::std::vector<T>& list, Fn f)
{
    int count = 0;
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(((*it)->*f)())
        {
            ++count;
        }
    }
    return count;
}